

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O2

c_int osqp_update_max_iter(OSQPWorkspace *work,c_int max_iter_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_max_iter");
    return cVar1;
  }
  if (0 < max_iter_new) {
    work->settings->max_iter = max_iter_new;
    return 0;
  }
  printf("ERROR in %s: ","osqp_update_max_iter");
  printf("max_iter must be positive");
  putchar(10);
  return 1;
}

Assistant:

c_int osqp_update_max_iter(OSQPWorkspace *work, c_int max_iter_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that max_iter is positive
  if (max_iter_new <= 0) {
#ifdef PRINTING
    c_eprint("max_iter must be positive");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update max_iter
  work->settings->max_iter = max_iter_new;

  return 0;
}